

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O2

void __thiscall QSystemLocaleData::~QSystemLocaleData(QSystemLocaleData *this)

{
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->uiLanguages).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->lc_collate_var).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->lc_measurement_var).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->lc_messages_var).d);
  QLocale::~QLocale(&this->lc_messages);
  QLocale::~QLocale(&this->lc_monetary);
  QLocale::~QLocale(&this->lc_time);
  QLocale::~QLocale(&this->lc_numeric);
  QReadWriteLock::~QReadWriteLock(&this->lock);
  return;
}

Assistant:

QSystemLocaleData()
        : lc_numeric(QLocale::C)
         ,lc_time(QLocale::C)
         ,lc_monetary(QLocale::C)
         ,lc_messages(QLocale::C)
    {
        readEnvironment();
    }